

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O0

void __thiscall adios2::transport::FileRemote::~FileRemote(FileRemote *this)

{
  Transport *in_RDI;
  unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *unaff_retaddr;
  FileRemote *in_stack_00000060;
  
  in_RDI->_vptr_Transport = (_func_int **)&PTR__FileRemote_01136130;
  if ((in_RDI->m_IsOpen & 1U) != 0) {
    Close(in_stack_00000060);
  }
  std::__cxx11::string::~string((string *)&in_RDI[1].m_Comm);
  std::__cxx11::string::~string((string *)&in_RDI[1].m_Name._M_string_length);
  std::__cxx11::string::~string((string *)&in_RDI[1].m_Library._M_string_length);
  std::future<int>::~future((future<int> *)0xd84419);
  std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::~unique_ptr(unaff_retaddr);
  Transport::~Transport(in_RDI);
  return;
}

Assistant:

FileRemote::~FileRemote()
{
    if (m_IsOpen)
    {
        Close();
    }
}